

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputreader.cpp
# Opt level: O1

void __thiscall InputReader::parseFile(InputReader *this,istream *fin,InputParser *parser)

{
  string *line_00;
  InputError *this_00;
  InputReader *this_01;
  string local_a0;
  undefined1 local_80 [8];
  string token;
  string line;
  
  token.field_2._8_8_ = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  local_80 = (undefined1  [8])&token._M_string_length;
  token._M_dataplus._M_p = (pointer)0x0;
  token._M_string_length._0_1_ = 0;
  line.field_2._8_8_ = parser;
  std::ios::clear((int)*(undefined8 *)(*(long *)fin + -0x18) + (int)fin);
  std::istream::seekg(fin,0,0);
  this->section = -1;
  if (this->errcount < 10) {
    line_00 = (string *)(token.field_2._M_local_buf + 8);
    do {
      this_01 = (InputReader *)fin;
      std::getline<char,std::char_traits<char>,std::allocator<char>>(fin,(string *)line_00,'\n');
      if (((*(uint *)(fin + *(long *)(*(long *)fin + -0x18) + 0x20) & 5) != 0 &
          (byte)((*(uint *)(fin + *(long *)(*(long *)fin + -0x18) + 0x20) & 2) >> 1)) != 0) break;
      trimLine(this_01,line_00);
      std::ios::clear((int)*(undefined8 *)(*(long *)this + -0x18) + (int)this);
      std::__cxx11::stringbuf::str((string *)&this->field_0x10);
      std::operator>>((istream *)this,(string *)local_80);
      if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 5) == 0) {
        if (*(char *)local_80 == '[') {
          findSection(this,(string *)local_80);
        }
        else if (*(char *)local_80 != '\0') {
          (**(code **)(*(long *)line.field_2._8_8_ + 0x10))
                    (line.field_2._8_8_,line_00,this->section);
        }
      }
    } while (this->errcount < 10);
  }
  if (0 < this->errcount) {
    this_00 = (InputError *)__cxa_allocate_exception(0x30);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0);
    InputError::InputError(this_00,0,&local_a0);
    __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
  }
  if (local_80 != (undefined1  [8])&token._M_string_length) {
    operator_delete((void *)local_80);
  }
  if ((size_type *)token.field_2._8_8_ != &line._M_string_length) {
    operator_delete((void *)token.field_2._8_8_);
  }
  return;
}

Assistant:

void InputReader::parseFile(istream& fin, InputParser& parser)
{
    string line;
    string token;

    // ... reset input file

    fin.clear();
    fin.seekg(0);
    section = -1;

    // ... read each line from input file

    for (;;)
    {
        if ( errcount >= MAXERRS ) break;
        getline(fin, line, '\n');
        if (fin.fail())
        {
            if ( fin.eof() ) break;    // end of file reached - normal termination
        }

        // ... remove any comment from input line

        trimLine(line);

        // ... read 1st token from input line

        sin.clear();                   // clear string stream status flags
        sin.str(line);                 // assign input line to string stream
        sin >> token;                  // read 1st token from string stream

        // ... skip blank lines

        if ( sin.fail() || token[0] == '\0' ) continue;
        try
        {
            // ... see if at start of new input section

            if ( token[0] == '[' ) findSection(token);

            // ... otherwise parse input line of data

            else parser.parseLine(line, section);
        }
        catch (InputError& e)
        {
            errcount++;
            if ( section >= 0 )
            {
                parser.network->msgLog << e.msg << " at following line of " <<
                    sections[section] << "] section:\n";
            }
            else
            {
                parser.network->msgLog << e.msg << " at following line of file:\n";
            }
            parser.network->msgLog << line << "\n";
        }
        catch (...)
        {
            errcount++;
        }
    }

    // ... throw general input file exception if errors were found

    if ( errcount > 0 ) throw InputError(InputError::ERRORS_IN_INPUT_DATA, "");
}